

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O2

void __thiscall imrt::ACS::printProbability(ACS *this)

{
  int iVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  int a;
  long lVar4;
  int i;
  long lVar5;
  int j;
  long lVar6;
  int r;
  int local_3c;
  long local_38;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Intensity probabilities:");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar6 = 0;
  while( true ) {
    iVar1 = Collimator::getNbAngles((this->super_ACO).collimator);
    if (iVar1 <= lVar6) break;
    local_38 = lVar6;
    for (lVar4 = 0; lVar4 < (this->super_ACO).max_apertures; lVar4 = lVar4 + 1) {
      lVar5 = 0;
      while( true ) {
        iVar1 = Collimator::getIntensityLevelSize((this->super_ACO).collimator);
        if (iVar1 <= lVar5) break;
        poVar2 = std::ostream::_M_insert<double>
                           ((this->super_ACO).iprobability.
                            super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar6].p[lVar4][lVar5]);
        std::operator<<(poVar2," ");
        lVar5 = lVar5 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    lVar6 = local_38 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Aperture probabilities:");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar6 = 0;
  while( true ) {
    iVar1 = Collimator::getNbAngles((this->super_ACO).collimator);
    if (iVar1 <= lVar6) break;
    local_38 = lVar6;
    for (local_3c = 0; local_3c < (this->super_ACO).max_apertures; local_3c = local_3c + 1) {
      lVar4 = 0;
      while( true ) {
        iVar1 = Collimator::getXdim((this->super_ACO).collimator);
        if (iVar1 <= lVar4) break;
        lVar5 = 0;
        while( true ) {
          iVar1 = Collimator::getReferenceSize((this->super_ACO).collimator);
          if (iVar1 <= lVar5) break;
          pmVar3 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[]((this->super_ACO).probability.
                                super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar6,&local_3c);
          poVar2 = std::ostream::_M_insert<double>(pmVar3->p[lVar4][lVar5]);
          std::operator<<(poVar2," ");
          lVar5 = lVar5 + 1;
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        lVar4 = lVar4 + 1;
      }
    }
    lVar6 = local_38 + 1;
  }
  return;
}

Assistant:

void ACS::printProbability() {
    cout << "Intensity probabilities:"<< endl;
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      for (int a = 0; a < max_apertures; a++) {
          for (int i = 0; i <  collimator.getIntensityLevelSize();i++) {
            cout << iprobability[s](a,i) << " ";
        }
        cout << endl;
      }
    }
    cout << "Aperture probabilities:" << endl;
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      for (int a = 0; a < max_apertures; a++) {
        for (int j = 0; j < collimator.getXdim(); j++) {
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            cout << probability[s][a](j,r) <<  " ";
          }
          cout << endl;
        }
      }
    }
  }